

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

uint16_t * getMissingLeavesList(uint16_t *challengeC,picnic_instance_t *params)

{
  ulong uVar1;
  uint16_t *puVar2;
  uint16_t uVar3;
  ulong uVar4;
  byte in_DL;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)in_DL;
  puVar2 = (uint16_t *)calloc(((ulong)params & 0xffff) - uVar7,2);
  if ((short)params != 0) {
    uVar4 = 0;
    lVar5 = 0;
    do {
      uVar3 = (uint16_t)uVar4;
      if (in_DL == 0) {
LAB_0011d3ba:
        puVar2[lVar5] = uVar3;
        lVar5 = lVar5 + 1;
      }
      else if (*challengeC != uVar3) {
        uVar1 = 1;
        do {
          uVar6 = uVar1;
          if (uVar7 == uVar6) break;
          uVar1 = uVar6 + 1;
        } while (challengeC[uVar6] != uVar3);
        if (uVar7 <= uVar6) goto LAB_0011d3ba;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != ((ulong)params & 0xffff));
  }
  return puVar2;
}

Assistant:

static uint16_t* getMissingLeavesList(uint16_t* challengeC, const picnic_instance_t* params) {
  size_t missingLeavesSize = params->num_rounds - params->num_opened_rounds;
  uint16_t* missingLeaves  = calloc(missingLeavesSize, sizeof(uint16_t));
  size_t pos               = 0;

  for (size_t i = 0; i < params->num_rounds; i++) {
    if (!contains(challengeC, params->num_opened_rounds, i)) {
      missingLeaves[pos] = i;
      pos++;
    }
  }

  return missingLeaves;
}